

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColorTable.cpp
# Opt level: O3

void __thiscall ColorTable::add_entry(ColorTable *this,double a,double b,Vector *c1,Vector *c2)

{
  int iVar1;
  Entry *pEVar2;
  double dVar3;
  
  iVar1 = this->color_entries;
  if (iVar1 < this->max_entries + -1) {
    pEVar2 = this->entries;
    pEVar2[iVar1].ta = a;
    pEVar2[iVar1].tb = b;
    dVar3 = c1->y;
    pEVar2[iVar1].ca.x = c1->x;
    pEVar2[iVar1].ca.y = dVar3;
    pEVar2[iVar1].ca.z = c1->z;
    dVar3 = c2->y;
    pEVar2[iVar1].cb.x = c2->x;
    pEVar2[iVar1].cb.y = dVar3;
    pEVar2[iVar1].cb.z = c2->z;
    this->color_entries = iVar1 + 1;
  }
  return;
}

Assistant:

void ColorTable::add_entry(double a, double b, Vector const& c1, Vector const& c2)
{
   if (color_entries < max_entries - 1)
   {
      entries[color_entries].ta = a;
      entries[color_entries].tb = b;
      entries[color_entries].ca = c1;
      entries[color_entries].cb = c2;
      color_entries++;
   }
}